

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::str_writer<char>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,str_writer<char> *f)

{
  fill_t<char> *fill;
  size_t n;
  size_t sVar1;
  byte bVar2;
  size_t sVar3;
  checked_ptr<typename_buffer<char>::value_type> it;
  char *pcVar4;
  ptrdiff_t _Num;
  ptrdiff_t _Num_1;
  ulong uVar5;
  size_t n_00;
  
  uVar5 = (ulong)(uint)specs->width;
  n = f->size_;
  sVar3 = n;
  if (uVar5 != 0) {
    sVar3 = basic_writer<fmt::v6::buffer_range<char>_>::str_writer<char>::width(f);
  }
  n_00 = uVar5 - sVar3;
  if (sVar3 <= uVar5 && n_00 != 0) {
    fill = &specs->fill;
    it = reserve<fmt::v6::internal::buffer<char>,_0>
                   ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,
                    (specs->fill).size_ * n_00 + n);
    bVar2 = specs->field_0x9 & 0xf;
    if (bVar2 == 3) {
      pcVar4 = fill<char*,char>(it,n_00 >> 1,fill);
      sVar1 = f->size_;
      if (sVar1 != 0) {
        memmove(pcVar4,f->s,sVar1);
      }
      pcVar4 = pcVar4 + sVar1;
      n_00 = n_00 - (n_00 >> 1);
    }
    else {
      if (bVar2 == 2) {
        pcVar4 = fill<char*,char>(it,n_00,fill);
        goto LAB_00124d1d;
      }
      sVar1 = f->size_;
      if (sVar1 != 0) {
        memmove(it,f->s,sVar1);
      }
      pcVar4 = it + sVar1;
    }
    fill<char*,char>(pcVar4,n_00,fill);
    return;
  }
  pcVar4 = reserve<fmt::v6::internal::buffer<char>,_0>
                     ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,n);
LAB_00124d1d:
  if (f->size_ != 0) {
    memmove(pcVar4,f->s,f->size_);
    return;
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }